

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Dispatch_Engine::Dispatch_Engine
          (Dispatch_Engine *this,ChaiScript_Parser_Base *parser)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->m_conversions).m_conversions._M_t._M_impl.super__Rb_tree_header;
  memset(this,0,0x88);
  (this->m_conversions).m_conversions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_conversions).m_conversions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->m_conversions).m_convertableTypes._M_t._M_impl.super__Rb_tree_header;
  (this->m_conversions).m_conversions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_conversions).m_convertableTypes._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->m_conversions).m_convertableTypes._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_conversions).m_convertableTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_conversions).m_convertableTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_conversions).m_convertableTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_conversions).m_convertableTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_conversions).m_num_types.super___atomic_base<unsigned_long>._M_i = 0;
  (this->m_stack_holder).m_key = (void *)0x0;
  (this->m_parser)._M_data = parser;
  (this->m_method_missing_loc).super___atomic_base<unsigned_long>._M_i = 0;
  State::State(&this->m_state);
  return;
}

Assistant:

explicit Dispatch_Engine(chaiscript::parser::ChaiScript_Parser_Base &parser)
          : m_stack_holder()
          , m_parser(parser) {
      }